

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_integer_sequence.cpp
# Opt level: O2

void encode_ise(quant_method quant_level,uint character_count,uint8_t *input_data,
               uint8_t *output_data,uint bit_offset)

{
  btq_count bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint bitcount;
  long lVar12;
  long local_90;
  
  if (character_count != 0) {
    bVar1 = btq_counts._M_elems[quant_level];
    bitcount = (byte)bVar1 & 0x3f;
    bVar3 = (byte)bitcount;
    uVar4 = ~(-1 << (bVar3 & 0x1f));
    if (((byte)bVar1 & 0x40) == 0) {
      if ((char)bVar1 < '\0') {
        local_90 = 0;
        uVar6 = bitcount + 2;
        for (uVar11 = (ulong)character_count / 3; uVar5 = (uint)local_90, (int)uVar11 != 0;
            uVar11 = (ulong)((int)uVar11 - 1)) {
          bVar2 = integer_of_quints[input_data[uVar5 + 2] >> (bVar3 & 0x1f)]
                  [input_data[uVar5 + 1] >> (bVar3 & 0x1f)][input_data[local_90] >> (bVar3 & 0x1f)];
          write_bits((bVar2 & 7) << (bVar3 & 0x1f) & 0xff | input_data[local_90] & uVar4,
                     bitcount + 3,bit_offset,output_data);
          uVar10 = bitcount + 3 + bit_offset;
          write_bits((bVar2 >> 3 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar5 + 1] & uVar4,uVar6
                     ,uVar10,output_data);
          local_90 = local_90 + 3;
          write_bits((bVar2 >> 5 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar5 + 2] & uVar4,uVar6
                     ,bit_offset + bitcount * 2 + 5,output_data);
          bit_offset = uVar10 + uVar6 * 2;
        }
        if (character_count != uVar5) {
          if ((uint)(local_90 + 1U) < character_count) {
            uVar11 = (ulong)(input_data[local_90 + 1U & 0xffffffff] >> (bVar3 & 0x1f));
          }
          else {
            uVar11 = 0;
          }
          bVar2 = integer_of_quints[0][uVar11][input_data[local_90] >> (bVar3 & 0x1f)];
          for (lVar12 = 0; (ulong)(local_90 + lVar12) < (ulong)character_count; lVar12 = lVar12 + 1)
          {
            uVar6 = "\x03\x02"[lVar12] + bitcount;
            write_bits((~(-1 << ("\x03\x02"[lVar12] & 0x1f)) & (uint)(bVar2 >> (""[lVar12] & 0x1f)))
                       << (bVar3 & 0x1f) & 0xff | input_data[local_90 + lVar12] & uVar4,uVar6,
                       bit_offset,output_data);
            bit_offset = bit_offset + uVar6;
          }
        }
      }
      else {
        for (uVar11 = 0; character_count != uVar11; uVar11 = uVar11 + 1) {
          write_bits((uint)input_data[uVar11],bitcount,bit_offset,output_data);
          bit_offset = bit_offset + bitcount;
        }
      }
    }
    else {
      uVar8 = 0;
      uVar6 = bitcount + 2;
      uVar5 = bitcount + 1;
      for (uVar11 = (ulong)character_count / 5; uVar10 = (uint)uVar8, (int)uVar11 != 0;
          uVar11 = (ulong)((int)uVar11 - 1)) {
        bVar2 = integer_of_trits[input_data[uVar10 + 4] >> (bVar3 & 0x1f)]
                [input_data[uVar10 + 3] >> (bVar3 & 0x1f)][input_data[uVar10 + 2] >> (bVar3 & 0x1f)]
                [input_data[uVar10 + 1] >> (bVar3 & 0x1f)][input_data[uVar8] >> (bVar3 & 0x1f)];
        write_bits((bVar2 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar8] & uVar4,uVar6,bit_offset
                   ,output_data);
        write_bits((bVar2 >> 2 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar10 + 1] & uVar4,uVar6,
                   uVar6 + bit_offset,output_data);
        write_bits((bVar2 >> 4 & 1) << (bVar3 & 0x1f) & 0xff | input_data[uVar10 + 2] & uVar4,uVar5,
                   bitcount * 2 + 4 + bit_offset,output_data);
        write_bits((bVar2 >> 5 & 3) << (bVar3 & 0x1f) & 0xff | input_data[uVar10 + 3] & uVar4,uVar6,
                   bitcount * 3 + 5 + bit_offset,output_data);
        uVar8 = uVar8 + 5;
        write_bits((uint)(bVar2 >> 7) << (bVar3 & 0x1f) & 0xff | input_data[uVar10 + 4] & uVar4,
                   uVar5,bit_offset + bitcount * 4 + 7,output_data);
        bit_offset = uVar6 + bit_offset + uVar6 * 2 + uVar5 * 2;
      }
      if (character_count != uVar10) {
        if ((uint)(uVar8 + 3) < character_count) {
          uVar11 = (ulong)(input_data[uVar8 + 3 & 0xffffffff] >> (bVar3 & 0x1f));
        }
        else {
          uVar11 = 0;
        }
        if ((uint)(uVar8 + 2) < character_count) {
          uVar7 = (ulong)(input_data[uVar8 + 2 & 0xffffffff] >> (bVar3 & 0x1f));
        }
        else {
          uVar7 = 0;
        }
        if ((uint)(uVar8 + 1) < character_count) {
          uVar9 = (ulong)(input_data[uVar8 + 1 & 0xffffffff] >> (bVar3 & 0x1f));
        }
        else {
          uVar9 = 0;
        }
        bVar2 = integer_of_trits[0][uVar11][uVar7][uVar9][input_data[uVar8] >> (bVar3 & 0x1f)];
        lVar12 = 0;
        for (; uVar8 < character_count; uVar8 = uVar8 + 1) {
          uVar6 = "\x02\x02\x01\x02"[lVar12] + bitcount;
          write_bits((~(-1 << ("\x02\x02\x01\x02"[lVar12] & 0x1f)) &
                     (uint)(bVar2 >> (""[lVar12] & 0x1f))) << (bVar3 & 0x1f) & 0xff |
                     input_data[uVar8] & uVar4,uVar6,bit_offset,output_data);
          bit_offset = bit_offset + uVar6;
          lVar12 = lVar12 + 1;
        }
      }
    }
    return;
  }
  __assert_fail("character_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_integer_sequence.cpp"
                ,500,
                "void encode_ise(quant_method, unsigned int, const uint8_t *, uint8_t *, unsigned int)"
               );
}

Assistant:

void encode_ise(
	quant_method quant_level,
	unsigned int character_count,
	const uint8_t* input_data,
	uint8_t* output_data,
	unsigned int bit_offset
) {
	promise(character_count > 0);

	unsigned int bits = btq_counts[quant_level].bits;
	unsigned int trits = btq_counts[quant_level].trits;
	unsigned int quints = btq_counts[quant_level].quints;
	unsigned int mask = (1 << bits) - 1;

	// Write out trits and bits
	if (trits)
	{
		unsigned int i = 0;
		unsigned int full_trit_blocks = character_count / 5;

		for (unsigned int j = 0; j < full_trit_blocks; j++)
		{
			unsigned int i4 = input_data[i + 4] >> bits;
			unsigned int i3 = input_data[i + 3] >> bits;
			unsigned int i2 = input_data[i + 2] >> bits;
			unsigned int i1 = input_data[i + 1] >> bits;
			unsigned int i0 = input_data[i + 0] >> bits;

			uint8_t T = integer_of_trits[i4][i3][i2][i1][i0];

			// The max size of a trit bit count is 6, so we can always safely
			// pack a single MX value with the following 1 or 2 T bits.
			uint8_t pack;

			// Element 0 + T0 + T1
			pack = (input_data[i++] & mask) | (((T >> 0) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 1 + T2 + T3
			pack = (input_data[i++] & mask) | (((T >> 2) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 2 + T4
			pack = (input_data[i++] & mask) | (((T >> 4) & 0x1) << bits);
			write_bits(pack, bits + 1, bit_offset, output_data);
			bit_offset += bits + 1;

			// Element 3 + T5 + T6
			pack = (input_data[i++] & mask) | (((T >> 5) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 4 + T7
			pack = (input_data[i++] & mask) | (((T >> 7) & 0x1) << bits);
			write_bits(pack, bits + 1, bit_offset, output_data);
			bit_offset += bits + 1;
		}

		// Loop tail for a partial block
		if (i != character_count)
		{
			// i4 cannot be present - we know the block is partial
			// i0 must be present - we know the block isn't empty
			unsigned int i4 =                            0;
			unsigned int i3 = i + 3 >= character_count ? 0 : input_data[i + 3] >> bits;
			unsigned int i2 = i + 2 >= character_count ? 0 : input_data[i + 2] >> bits;
			unsigned int i1 = i + 1 >= character_count ? 0 : input_data[i + 1] >> bits;
			unsigned int i0 =                                input_data[i + 0] >> bits;

			uint8_t T = integer_of_trits[i4][i3][i2][i1][i0];

			for (unsigned int j = 0; i < character_count; i++, j++)
			{
				// Truncated table as this iteration is always partital
				static const uint8_t tbits[4]  { 2, 2, 1, 2 };
				static const uint8_t tshift[4] { 0, 2, 4, 5 };

				uint8_t pack = (input_data[i] & mask) |
				               (((T >> tshift[j]) & ((1 << tbits[j]) - 1)) << bits);

				write_bits(pack, bits + tbits[j], bit_offset, output_data);
				bit_offset += bits + tbits[j];
			}
		}
	}
	// Write out quints and bits
	else if (quints)
	{
		unsigned int i = 0;
		unsigned int full_quint_blocks = character_count / 3;

		for (unsigned int j = 0; j < full_quint_blocks; j++)
		{
			unsigned int i2 = input_data[i + 2] >> bits;
			unsigned int i1 = input_data[i + 1] >> bits;
			unsigned int i0 = input_data[i + 0] >> bits;

			uint8_t T = integer_of_quints[i2][i1][i0];

			// The max size of a quint bit count is 5, so we can always safely
			// pack a single M value with the following 2 or 3 T bits.
			uint8_t pack;

			// Element 0
			pack = (input_data[i++] & mask) | (((T >> 0) & 0x7) << bits);
			write_bits(pack, bits + 3, bit_offset, output_data);
			bit_offset += bits + 3;

			// Element 1
			pack = (input_data[i++] & mask) | (((T >> 3) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;

			// Element 2
			pack = (input_data[i++] & mask) | (((T >> 5) & 0x3) << bits);
			write_bits(pack, bits + 2, bit_offset, output_data);
			bit_offset += bits + 2;
		}

		// Loop tail for a partial block
		if (i != character_count)
		{
			// i2 cannot be present - we know the block is partial
			// i0 must be present - we know the block isn't empty
			unsigned int i2 =                            0;
			unsigned int i1 = i + 1 >= character_count ? 0 : input_data[i + 1] >> bits;
			unsigned int i0 =                                input_data[i + 0] >> bits;

			uint8_t T = integer_of_quints[i2][i1][i0];

			for (unsigned int j = 0; i < character_count; i++, j++)
			{
				// Truncated table as this iteration is always partital
				static const uint8_t tbits[2]  { 3, 2 };
				static const uint8_t tshift[2] { 0, 3 };

				uint8_t pack = (input_data[i] & mask) |
				               (((T >> tshift[j]) & ((1 << tbits[j]) - 1)) << bits);

				write_bits(pack, bits + tbits[j], bit_offset, output_data);
				bit_offset += bits + tbits[j];
			}
		}
	}
	// Write out just bits
	else
	{
		for (unsigned int i = 0; i < character_count; i++)
		{
			write_bits(input_data[i], bits, bit_offset, output_data);
			bit_offset += bits;
		}
	}
}